

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_kernel.cxx
# Opt level: O2

XCKernel * __thiscall ExchCXX::XCKernel::operator=(XCKernel *this,XCKernel *other)

{
  _Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> _Var1;
  _Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> _Var2;
  XCKernelImpl *in_RAX;
  _Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  (*((other->pimpl_)._M_t.
     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
     ._M_t.
     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl)->
    _vptr_XCKernelImpl[2])(&local_18);
  _Var2._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (XCKernelImpl *)0x0;
  _Var1._M_head_impl =
       (this->pimpl_)._M_t.
       super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
       .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl;
  (this->pimpl_)._M_t.
  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (XCKernelImpl *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_XCKernelImpl[1])();
    if (local_18._M_head_impl != (XCKernelImpl *)0x0) {
      (*(local_18._M_head_impl)->_vptr_XCKernelImpl[1])();
    }
  }
  return this;
}

Assistant:

XCKernel& XCKernel::operator=( const XCKernel& other ) {
  return *this = XCKernel(other);
}